

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O2

flexScore negaMax(game *Game,int depth,flexScore alpha,flexScore beta)

{
  double dVar1;
  bool bVar2;
  move moveMade;
  uint extraout_XMM0_Dd;
  flexScore beta_00;
  flexScore fVar3;
  flexScore fVar4;
  flexScore score;
  arrayMoveList moves;
  flexScore local_598;
  flexScore local_588;
  int local_578;
  uint uStack_574;
  uint uStack_56c;
  flexScore local_568;
  game local_558;
  game local_448;
  arrayMoveList local_338;
  
  local_588._8_8_ = beta._8_8_;
  local_588.score = beta.score;
  local_598._8_8_ = alpha._8_8_;
  local_598.score = alpha.score;
  local_578 = depth;
  if (depth == 0) {
    bVar2 = Game->blacksTurn;
    game::game(&local_558,Game);
    dVar1 = positionStrengthFast(&local_558);
    local_578 = SUB84(dVar1,0);
    uStack_574 = (uint)((ulong)dVar1 >> 0x20);
    uStack_56c = extraout_XMM0_Dd;
    if (bVar2 != false) {
      uStack_574 = uStack_574 ^ 0x80000000;
      uStack_56c = extraout_XMM0_Dd ^ 0x80000000;
    }
    game::~game(&local_558);
    local_588._8_8_ = 0;
  }
  else {
    game::generateLegalMoves(&local_338,Game);
    arrayMoveList::resetIterator(&local_338);
    bVar2 = arrayMoveList::next(&local_338);
    if (bVar2) {
      arrayMoveList::resetIterator(&local_338);
      local_578 = local_578 + -1;
      while (bVar2 = arrayMoveList::next(&local_338), bVar2) {
        moveMade = arrayMoveList::getMove(&local_338);
        game::makeMove(Game,moveMade);
        game::game(&local_448,Game);
        fVar3._8_8_ = ((ulong)(local_588.count + 1) | local_588._8_8_ & 0xff01ffff00000000) ^
                      0x1000000000000;
        beta_00._8_8_ =
             ((ulong)(local_598.count + 1) | local_598._8_8_ & 0xff01ffff00000000) ^ 0x1000000000000
        ;
        fVar3.score = local_588.score;
        beta_00.score = local_598.score;
        fVar3 = negaMax(&local_448,local_578,fVar3,beta_00);
        local_568._8_8_ =
             ((ulong)(fVar3.count - 1) | fVar3._8_8_ & 0xff01ffff00000000) ^ 0x1000000000000;
        local_568.score = fVar3.score;
        game::~game(&local_448);
        game::undoMove(Game);
        bVar2 = flexScore::operator>=(&local_568,&local_588);
        if (bVar2) {
          local_578 = SUB84(local_588.score,0);
          uStack_574 = (uint)((ulong)local_588.score >> 0x20);
          goto LAB_00102c2b;
        }
        bVar2 = flexScore::operator>(&local_568,&local_598);
        if (bVar2) {
          local_598.score = local_568.score;
          local_598.count = local_568.count;
          local_598.draw = local_568.draw;
          local_598.tethered = local_568.tethered;
          local_598.favorable = local_568.favorable;
          local_598.extreme = local_568.extreme;
        }
      }
      local_578 = SUB84(local_598.score,0);
      uStack_574 = (uint)((ulong)local_598.score >> 0x20);
      local_588._8_8_ = local_598._8_8_;
    }
    else {
      local_588._8_8_ = 0x10100000000;
      local_578 = 0;
      uStack_574 = 0;
    }
  }
LAB_00102c2b:
  fVar4.score._4_4_ = uStack_574;
  fVar4.score._0_4_ = local_578;
  fVar4.count = (int)local_588._8_8_;
  fVar4.draw = (bool)(char)((ulong)local_588._8_8_ >> 0x20);
  fVar4.tethered = (bool)(char)((ulong)local_588._8_8_ >> 0x28);
  fVar4.favorable = (bool)(char)((ulong)local_588._8_8_ >> 0x30);
  fVar4.extreme = (bool)(char)((ulong)local_588._8_8_ >> 0x38);
  return fVar4;
}

Assistant:

flexScore negaMax(game Game, int depth, flexScore alpha, flexScore beta) {
    if(depth == 0) {
      double side;
      if(Game.blacksTurn) {
        side = -1.0;
      } else {
        side = 1.0;
      }

      flexScore returner;
      returner.score = side*positionStrengthFast(Game);
      return returner;
    }

    arrayMoveList moves = Game.generateLegalMoves();
    moves.resetIterator();
    if(!moves.next()) {
      flexScore returner;
      returner.tethered = true;
      returner.count = 0;
      returner.draw = true; // We currently assume this is a draw
      return returner;
    }
    moves.resetIterator();
    while(moves.next()) {
      Game.makeMove(moves.getMove());
      flexScore score = -negaMax(Game, depth - 1, --beta, --alpha);
      Game.undoMove();
      if(score >= beta) {
        return beta;
      }
      if(score > alpha)
        alpha = score;
    }

    return alpha;
}